

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

base_learner * lda_setup(options_i *options,vw *all)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  pointer piVar4;
  undefined8 uVar5;
  bool bVar6;
  options_i *poVar7;
  int iVar8;
  lda *location;
  option_group_definition *poVar9;
  typed_option<float> *ptVar10;
  typed_option<unsigned_long> *ptVar11;
  typed_option<int> *ptVar12;
  parser *ppVar13;
  learner<lda,_example> *plVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  code *pcVar18;
  uint stride_shift;
  undefined **ppuVar19;
  code *pcVar20;
  label_parser *plVar21;
  ulong uVar22;
  byte bVar23;
  float fVar24;
  int math_mode;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_7;
  size_type __dnew_6;
  size_type __dnew_5;
  size_type __dnew_4;
  size_type __dnew_3;
  size_type __dnew_2;
  size_type __dnew_1;
  lda_math_mode local_ca4;
  _func_int ***local_ca0;
  _func_int **local_c98;
  _func_int **local_c90 [2];
  bool *local_c80;
  size_t *local_c78;
  options_i *local_c70;
  _func_int ***local_c68;
  _func_int **local_c60;
  _func_int **local_c58 [2];
  _func_int ***local_c48;
  _func_int **local_c40;
  _func_int **local_c38 [2];
  _func_int ***local_c28;
  _func_int **local_c20;
  _func_int **local_c18 [2];
  _func_int ***local_c08;
  _func_int **local_c00;
  _func_int **local_bf8 [2];
  _func_int ***local_be8;
  _func_int **local_be0;
  _func_int **local_bd8 [2];
  _func_int ***local_bc8;
  _func_int **local_bc0;
  _func_int **local_bb8 [2];
  string local_ba8;
  string local_b88;
  string local_b68;
  string local_b48;
  string local_b28;
  string local_b08;
  string local_ae8;
  option_group_definition local_ac8;
  _func_int ***local_a90;
  _func_int **local_a88;
  _func_int **local_a80 [2];
  undefined7 *local_a70;
  undefined8 local_a68;
  undefined7 local_a60;
  undefined1 uStack_a59;
  undefined7 uStack_a58;
  undefined1 local_a51;
  string local_a50;
  undefined1 local_a30 [112];
  bool local_9c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_998;
  undefined1 local_990 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_908;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8f8;
  typed_option<int> local_8f0;
  typed_option<unsigned_long> local_850;
  typed_option<float> local_7b0;
  typed_option<float> local_710;
  typed_option<float> local_670;
  typed_option<float> local_5d0;
  typed_option<bool> local_530;
  typed_option<int> local_490;
  typed_option<unsigned_long> local_3f0;
  typed_option<float> local_350;
  typed_option<float> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<unsigned_long> local_d0;
  
  bVar23 = 0;
  location = calloc_or_throw<lda>(1);
  memset(location,0,400);
  local_a30._0_8_ = (_func_int **)0x1b;
  local_ca0 = local_c90;
  local_ca0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_ca0,(ulong)local_a30);
  local_c90[0] = (_func_int **)local_a30._0_8_;
  builtin_strncpy((char *)((long)local_ca0 + 0xb),"chlet Al",8);
  builtin_strncpy((char *)((long)local_ca0 + 0x13),"location",8);
  *(undefined4 *)local_ca0 = 0x6574614c;
  builtin_strncpy((char *)((long)local_ca0 + 4),"nt D",4);
  *(undefined4 *)(local_ca0 + 1) = 0x63697269;
  builtin_strncpy((char *)((long)local_ca0 + 0xc),"hlet",4);
  local_c98 = (_func_int **)local_a30._0_8_;
  *(char *)((long)local_ca0 + local_a30._0_8_) = '\0';
  local_ac8.m_name._M_dataplus._M_p = (pointer)&local_ac8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ac8,local_ca0,(char *)(local_a30._0_8_ + (long)local_ca0));
  local_ac8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ac8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ac8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_ca0 != local_c90) {
    operator_delete(local_ca0);
  }
  local_ae8._M_dataplus._M_p = (pointer)&local_ae8.field_2;
  local_ae8.field_2._M_allocated_capacity._0_4_ = 0x61646c;
  local_ae8._M_string_length = 3;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_a30,&local_ae8,&location->topics);
  local_9c0 = true;
  local_bc8 = local_bb8;
  local_5d0.super_base_option._vptr_base_option = (_func_int **)0x19;
  local_bc8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_bc8,(ulong)&local_5d0);
  local_bb8[0] = local_5d0.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_bc8 + 9),"ith <int",8);
  builtin_strncpy((char *)((long)local_bc8 + 0x11),"> topics",8);
  *local_bc8 = (_func_int **)0x2061646c206e7552;
  local_bc8[1] = (_func_int **)0x6e693c2068746977;
  local_bc0 = local_5d0.super_base_option._vptr_base_option;
  *(char *)((long)local_bc8 + (long)local_5d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_a30 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_d0,(typed_option<unsigned_long> *)local_a30);
  poVar9 = VW::config::option_group_definition::add<unsigned_long>(&local_ac8,&local_d0);
  local_b08._M_dataplus._M_p = (pointer)&local_b08.field_2;
  local_b08.field_2._M_allocated_capacity = 0x68706c615f61646c;
  local_b08.field_2._8_2_ = 0x61;
  local_b08._M_string_length = 9;
  local_c70 = options;
  VW::config::typed_option<float>::typed_option(&local_5d0,&local_b08,&location->lda_alpha);
  local_5d0.super_base_option.m_keep = true;
  ptVar10 = VW::config::typed_option<float>::default_value(&local_5d0,0.1);
  local_be8 = local_bd8;
  local_670.super_base_option._vptr_base_option = (_func_int **)0x2f;
  local_be8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_be8,(ulong)&local_670);
  local_bd8[0] = local_670.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_be8 + 0x1f),"nt topic",8);
  builtin_strncpy((char *)((long)local_be8 + 0x27)," weights",8);
  local_be8[2] = (_func_int **)0x72657020666f2079;
  local_be8[3] = (_func_int **)0x6e656d75636f642d;
  *local_be8 = (_func_int **)0x6e6f20726f697250;
  local_be8[1] = (_func_int **)0x7469737261707320;
  local_be0 = local_670.super_base_option._vptr_base_option;
  *(char *)((long)local_be8 + (long)local_670.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_170,ptVar10);
  poVar9 = VW::config::option_group_definition::add<float>(poVar9,&local_170);
  local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
  local_b28.field_2._M_allocated_capacity._0_4_ = 0x5f61646c;
  local_b28.field_2._M_allocated_capacity._4_3_ = 0x6f6872;
  local_b28._M_string_length = 7;
  local_b28.field_2._M_local_buf[7] = '\0';
  VW::config::typed_option<float>::typed_option(&local_670,&local_b28,&location->lda_rho);
  local_670.super_base_option.m_keep = true;
  ptVar10 = VW::config::typed_option<float>::default_value(&local_670,0.1);
  local_c08 = local_bf8;
  local_710.super_base_option._vptr_base_option = (_func_int **)0x28;
  local_c08 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_c08,(ulong)&local_710);
  local_bf8[0] = local_710.super_base_option._vptr_base_option;
  local_c08[2] = (_func_int **)0x706f7420666f2079;
  local_c08[3] = (_func_int **)0x7274736964206369;
  *local_c08 = (_func_int **)0x6e6f20726f697250;
  local_c08[1] = (_func_int **)0x7469737261707320;
  local_c08[4] = (_func_int **)0x736e6f6974756269;
  local_c00 = local_710.super_base_option._vptr_base_option;
  *(char *)((long)local_c08 + (long)local_710.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_210,ptVar10);
  poVar9 = VW::config::option_group_definition::add<float>(poVar9,&local_210);
  local_b48._M_dataplus._M_p = (pointer)&local_b48.field_2;
  local_b48.field_2._M_allocated_capacity._0_4_ = 0x5f61646c;
  local_b48.field_2._M_allocated_capacity._4_2_ = 0x44;
  local_b48._M_string_length = 5;
  VW::config::typed_option<float>::typed_option(&local_710,&local_b48,&location->lda_D);
  ptVar10 = VW::config::typed_option<float>::default_value(&local_710,10000.0);
  local_c28 = local_c18;
  local_7b0.super_base_option._vptr_base_option = (_func_int **)0x13;
  local_c28 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_c28,(ulong)&local_7b0);
  local_c18[0] = local_7b0.super_base_option._vptr_base_option;
  *local_c28 = (_func_int **)0x6f207265626d754e;
  local_c28[1] = (_func_int **)0x656d75636f642066;
  builtin_strncpy((char *)((long)local_c28 + 0xf),"ents",4);
  local_c20 = local_7b0.super_base_option._vptr_base_option;
  *(char *)((long)local_c28 + (long)local_7b0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_2b0,ptVar10);
  poVar9 = VW::config::option_group_definition::add<float>(poVar9,&local_2b0);
  local_b68._M_dataplus._M_p = (pointer)&local_b68.field_2;
  local_b68.field_2._M_allocated_capacity._0_7_ = 0x7370655f61646c;
  local_b68.field_2._7_4_ = 0x6e6f6c69;
  local_b68._M_string_length = 0xb;
  local_b68.field_2._M_local_buf[0xb] = '\0';
  VW::config::typed_option<float>::typed_option(&local_7b0,&local_b68,&location->lda_epsilon);
  ptVar10 = VW::config::typed_option<float>::default_value(&local_7b0,0.001);
  local_c48 = local_c38;
  local_850.super_base_option._vptr_base_option = (_func_int **)0x1a;
  local_c48 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_c48,(ulong)&local_850);
  local_c38[0] = local_850.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_c48 + 10),"rgence t",8);
  builtin_strncpy((char *)((long)local_c48 + 0x12),"hreshold",8);
  *local_c48 = (_func_int **)0x6e6f6320706f6f4c;
  local_c48[1] = (_func_int **)0x65636e6567726576;
  local_c40 = local_850.super_base_option._vptr_base_option;
  *(char *)((long)local_c48 + (long)local_850.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_350,ptVar10);
  poVar9 = VW::config::option_group_definition::add<float>(poVar9,&local_350);
  local_b88._M_dataplus._M_p = (pointer)&local_b88.field_2;
  local_b88.field_2._M_allocated_capacity = 0x63746162696e696d;
  local_b88.field_2._8_2_ = 0x68;
  local_b88._M_string_length = 9;
  local_c78 = &location->minibatch;
  VW::config::typed_option<unsigned_long>::typed_option(&local_850,&local_b88,local_c78);
  ptVar11 = VW::config::typed_option<unsigned_long>::default_value(&local_850,1);
  local_c68 = local_c58;
  local_8f0.super_base_option._vptr_base_option = (_func_int **)0x17;
  local_c68 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_c68,(ulong)&local_8f0);
  local_c58[0] = local_8f0.super_base_option._vptr_base_option;
  *local_c68 = (_func_int **)0x63746162696e694d;
  local_c68[1] = (_func_int **)0x202c657a69732068;
  builtin_strncpy((char *)((long)local_c68 + 0xf)," for LDA",8);
  local_c60 = local_8f0.super_base_option._vptr_base_option;
  *(char *)((long)local_c68 + (long)local_8f0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar11->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_3f0,ptVar11);
  poVar9 = VW::config::option_group_definition::add<unsigned_long>(poVar9,&local_3f0);
  local_ba8._M_dataplus._M_p = (pointer)&local_ba8.field_2;
  local_ba8.field_2._M_allocated_capacity = 0x646f6d2d6874616d;
  local_ba8.field_2._8_2_ = 0x65;
  local_ba8._M_string_length = 9;
  VW::config::typed_option<int>::typed_option(&local_8f0,&local_ba8,(int *)&local_ca4);
  ptVar12 = VW::config::typed_option<int>::default_value(&local_8f0,0);
  local_990._0_8_ = (_func_int **)0x26;
  local_a90 = local_a80;
  local_a90 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_a90,(ulong)local_990);
  local_a80[0] = (_func_int **)local_990._0_8_;
  local_a90[2] = (_func_int **)0x6361727563636120;
  local_a90[3] = (_func_int **)0x2d74736166202c79;
  *local_a90 = (_func_int **)0x646f6d206874614d;
  local_a90[1] = (_func_int **)0x2c646d6973203a65;
  builtin_strncpy((char *)((long)local_a90 + 0x1e),"t-approx",8);
  local_a88 = (_func_int **)local_990._0_8_;
  *(char *)((long)local_a90 + local_990._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar12->super_base_option).m_help);
  VW::config::typed_option<int>::typed_option(&local_490,ptVar12);
  poVar9 = VW::config::option_group_definition::add<int>(poVar9,&local_490);
  local_a50.field_2._M_allocated_capacity._0_4_ = 0x7274656d;
  local_a50.field_2._M_allocated_capacity._4_3_ = 0x736369;
  local_a50._M_string_length = 7;
  local_a50.field_2._M_local_buf[7] = '\0';
  local_c80 = &location->compute_coherence_metrics;
  local_a50._M_dataplus._M_p = (pointer)&local_a50.field_2;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_990,&local_a50,local_c80)
  ;
  local_a60 = 0x657475706d6f43;
  uStack_a59 = 0x20;
  uStack_a58 = 0x7363697274656d;
  local_a68 = 0xf;
  local_a51 = 0;
  local_a70 = &local_a60;
  std::__cxx11::string::_M_assign((string *)(local_990 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_530,(typed_option<bool> *)local_990);
  VW::config::option_group_definition::add<bool>(poVar9,&local_530);
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd018;
  if (local_530.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if (local_a70 != &local_a60) {
    operator_delete(local_a70);
  }
  local_990._0_8_ = &PTR__typed_option_002cd018;
  if (local_8f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8f8._M_pi);
  }
  if (local_908._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_908._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_990);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50._M_dataplus._M_p != &local_a50.field_2) {
    operator_delete(local_a50._M_dataplus._M_p);
  }
  poVar7 = local_c70;
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd9e8;
  if (local_490.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if (local_a90 != local_a80) {
    operator_delete(local_a90);
  }
  local_8f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd9e8;
  if (local_8f0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_8f0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_8f0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
    operator_delete(local_ba8._M_dataplus._M_p);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0b8;
  if (local_3f0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_c68 != local_c58) {
    operator_delete(local_c68);
  }
  local_850.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0b8;
  if (local_850.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_850.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_850.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b88._M_dataplus._M_p != &local_b88.field_2) {
    operator_delete(local_b88._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_350.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_c48 != local_c38) {
    operator_delete(local_c48);
  }
  local_7b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_7b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_7b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_7b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b68._M_dataplus._M_p != &local_b68.field_2) {
    operator_delete(local_b68._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_c28 != local_c18) {
    operator_delete(local_c28);
  }
  local_710.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_710.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_710.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_710.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48._M_dataplus._M_p != &local_b48.field_2) {
    operator_delete(local_b48._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_c08 != local_bf8) {
    operator_delete(local_c08);
  }
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_670.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_be8 != local_bd8) {
    operator_delete(local_be8);
  }
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_5d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
    operator_delete(local_b08._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0b8;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_bc8 != local_bb8) {
    operator_delete(local_bc8);
  }
  local_a30._0_8_ = &PTR__typed_option_002cd0b8;
  if (local_998._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_998._M_pi);
  }
  if (local_9a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_a30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._M_dataplus._M_p != &local_ae8.field_2) {
    operator_delete(local_ae8._M_dataplus._M_p);
  }
  (**poVar7->_vptr_options_i)(poVar7,&local_ac8);
  location->mmode = local_ca4;
  local_a30._16_4_ = 0x61646c;
  local_a30._8_8_ = (pointer)0x3;
  local_a30._0_8_ = local_a30 + 0x10;
  iVar8 = (*poVar7->_vptr_options_i[1])(poVar7,local_a30);
  if ((undefined1 *)local_a30._0_8_ != local_a30 + 0x10) {
    operator_delete((void *)local_a30._0_8_);
  }
  if ((char)iVar8 == '\0') {
    plVar14 = (learner<lda,_example> *)0x0;
  }
  else {
    all->lda = (uint32_t)location->topics;
    all->delete_prediction = delete_scalars;
    piVar4 = (location->sorted_features).
             super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl.
             super__Vector_impl_data._M_start;
    (location->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (location->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (location->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (piVar4 != (pointer)0x0) {
      operator_delete(piVar4);
    }
    location->total_lambda_init = false;
    location->all = all;
    location->example_t = (double)all->initial_t;
    if (location->compute_coherence_metrics == true) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&location->feature_counts,1L << ((byte)all->num_bits & 0x3f) & 0xffffffff);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::resize(&location->feature_to_example_map,1L << ((byte)all->num_bits & 0x3f) & 0xffffffff);
    }
    fVar24 = logf((float)(all->lda * 2 + 1));
    fVar24 = ceilf(fVar24 / 0.6931472);
    stride_shift = (uint)(long)fVar24 |
                   (uint)(long)(fVar24 - 9.223372e+18) & (uint)((long)fVar24 >> 0x3f);
    if ((all->weights).sparse == true) {
      sparse_parameters::stride_shift(&(all->weights).sparse_weights,stride_shift);
    }
    else {
      (all->weights).dense_weights._stride_shift = stride_shift;
    }
    all->random_weights = true;
    all->add_constant = false;
    if (1.0 < all->eta) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"your learning rate is too high, setting it to 1",0x2f);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
      fVar24 = 1.0;
      if (all->eta <= 1.0) {
        fVar24 = all->eta;
      }
      all->eta = fVar24;
    }
    uVar22 = *local_c78;
    uVar15 = 0;
    if (1 < uVar22) {
      uVar17 = uVar22 - 1;
      if (uVar22 == 0) {
        uVar17 = uVar15;
      }
      do {
        uVar15 = uVar15 + 1;
        bVar6 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar6);
    }
    uVar22 = 1L << ((byte)uVar15 & 0x3f);
    ppVar13 = all->p;
    if (ppVar13->ring_size < uVar22) {
      if (ppVar13 != (parser *)0x0) {
        parser::~parser(ppVar13);
        operator_delete(ppVar13);
      }
      ppVar13 = (parser *)operator_new(0x390);
      parser::parser(ppVar13,uVar22);
      all->p = ppVar13;
    }
    v_array<float>::resize(&location->v,(ulong)all->lda * location->minibatch);
    local_a30._0_8_ = local_a30._0_8_ & 0xffffffff00000000;
    v_array<float>::push_back(&location->decay_levels,(float *)local_a30);
    ppuVar19 = &no_label::no_label_parser;
    plVar21 = &all->p->lp;
    for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
      plVar21->default_label = (_func_void_void_ptr *)*ppuVar19;
      ppuVar19 = ppuVar19 + (ulong)bVar23 * -2 + 1;
      plVar21 = (label_parser *)((long)plVar21 + (ulong)bVar23 * -0x10 + 8);
    }
    bVar6 = *local_c80;
    bVar1 = (all->weights).sparse;
    uVar2 = (all->weights).sparse_weights._stride_shift;
    uVar3 = (all->weights).dense_weights._stride_shift;
    plVar14 = calloc_or_throw<LEARNER::learner<lda,example>>(1);
    bVar23 = (byte)uVar3;
    if (bVar1 != false) {
      bVar23 = (byte)uVar2;
    }
    pcVar18 = learn;
    if (bVar6 != false) {
      pcVar18 = learn_with_metrics;
    }
    pcVar20 = predict;
    if (bVar6 != false) {
      pcVar20 = predict_with_metrics;
    }
    *(undefined8 *)(plVar14 + 0xd8) = 1;
    *(long *)(plVar14 + 0xe0) = 1L << (bVar23 & 0x3f);
    *(code **)(plVar14 + 0x98) = LEARNER::noop;
    *(code **)(plVar14 + 0xb0) = LEARNER::noop;
    *(code **)(plVar14 + 0x10) = LEARNER::noop;
    *(lda **)(plVar14 + 0xb8) = location;
    *(code **)(plVar14 + 200) = LEARNER::noop;
    *(code **)(plVar14 + 0x50) = LEARNER::noop_sensitivity;
    *(lda **)(plVar14 + 0x58) = location;
    *(code **)(plVar14 + 0x68) = return_simple_example;
    *(lda **)(plVar14 + 0x18) = location;
    *(code **)(plVar14 + 0x28) = pcVar18;
    *(code **)(plVar14 + 0x38) = pcVar18;
    *(code **)(plVar14 + 0x30) = pcVar20;
    *(undefined8 *)(plVar14 + 0x40) = 0;
    *(undefined4 *)(plVar14 + 0xd0) = 1;
    plVar14[0xe8] = (learner<lda,_example>)0x0;
    *(code **)(plVar14 + 0x80) = save_load;
    *(lda **)(plVar14 + 0x70) = location;
    uVar5 = *(undefined8 *)(plVar14 + 0x20);
    *(undefined8 *)(plVar14 + 0x78) = uVar5;
    *(code **)(plVar14 + 0x68) = finish_example;
    *(lda **)(plVar14 + 0xa0) = location;
    *(undefined8 *)(plVar14 + 0xa8) = uVar5;
    *(code **)(plVar14 + 0xb0) = end_examples;
    *(lda **)(plVar14 + 0x88) = location;
    *(undefined8 *)(plVar14 + 0x90) = uVar5;
    *(code **)(plVar14 + 0x98) = end_pass;
    *(lda **)(plVar14 + 0xb8) = location;
    *(undefined8 *)(plVar14 + 0xc0) = uVar5;
    *(code **)(plVar14 + 200) = finish;
    location = (lda *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_ac8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8.m_name._M_dataplus._M_p != &local_ac8.m_name.field_2) {
    operator_delete(local_ac8.m_name._M_dataplus._M_p);
  }
  if (location != (lda *)0x0) {
    destroy_free<lda>(location);
  }
  return (base_learner *)plVar14;
}

Assistant:

LEARNER::base_learner *lda_setup(options_i &options, vw &all)
{
  auto ld = scoped_calloc_or_throw<lda>();
  option_group_definition new_options("Latent Dirichlet Allocation");
  int math_mode;
  new_options.add(make_option("lda", ld->topics).keep().help("Run lda with <int> topics"))
      .add(make_option("lda_alpha", ld->lda_alpha)
               .keep()
               .default_value(0.1f)
               .help("Prior on sparsity of per-document topic weights"))
      .add(make_option("lda_rho", ld->lda_rho)
               .keep()
               .default_value(0.1f)
               .help("Prior on sparsity of topic distributions"))
      .add(make_option("lda_D", ld->lda_D).default_value(10000.0f).help("Number of documents"))
      .add(make_option("lda_epsilon", ld->lda_epsilon).default_value(0.001f).help("Loop convergence threshold"))
      .add(make_option("minibatch", ld->minibatch).default_value(1).help("Minibatch size, for LDA"))
      .add(make_option("math-mode", math_mode).default_value(USE_SIMD).help("Math mode: simd, accuracy, fast-approx"))
      .add(make_option("metrics", ld->compute_coherence_metrics).help("Compute metrics"));
  options.add_and_parse(new_options);

  // Convert from int to corresponding enum value.
  ld->mmode = static_cast<lda_math_mode>(math_mode);

  if (!options.was_supplied("lda"))
    return nullptr;

  all.lda = (uint32_t)ld->topics;
  all.delete_prediction = delete_scalars;
  ld->sorted_features = std::vector<index_feature>();
  ld->total_lambda_init = 0;
  ld->all = &all;
  ld->example_t = all.initial_t;
  if (ld->compute_coherence_metrics)
  {
    ld->feature_counts.resize((uint32_t)(UINT64_ONE << all.num_bits));
    ld->feature_to_example_map.resize((uint32_t)(UINT64_ONE << all.num_bits));
  }

  float temp = ceilf(logf((float)(all.lda * 2 + 1)) / logf(2.f));

  all.weights.stride_shift((size_t)temp);
  all.random_weights = true;
  all.add_constant = false;

  if (all.eta > 1.)
  {
    std::cerr << "your learning rate is too high, setting it to 1" << std::endl;
    all.eta = min(all.eta, 1.f);
  }

  size_t minibatch2 = next_pow2(ld->minibatch);
  if(minibatch2 > all.p->ring_size)
  {
    delete all.p;
    all.p = new parser{minibatch2};
  }

  ld->v.resize(all.lda * ld->minibatch);

  ld->decay_levels.push_back(0.f);

  all.p->lp = no_label::no_label_parser;

  LEARNER::learner<lda, example> &l = init_learner(ld, ld->compute_coherence_metrics ? learn_with_metrics : learn,
      ld->compute_coherence_metrics ? predict_with_metrics : predict, UINT64_ONE << all.weights.stride_shift(),
      prediction_type::scalars);

  l.set_save_load(save_load);
  l.set_finish_example(finish_example);
  l.set_end_examples(end_examples);
  l.set_end_pass(end_pass);
  l.set_finish(finish);

  return make_base(l);
}